

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint readChunk_tEXt(LodePNGInfo *info,uchar *data,size_t chunkLength)

{
  long lVar1;
  uint uVar2;
  char *key;
  char *str;
  size_t size;
  size_t __n;
  ulong __size;
  uint uVar3;
  char *orig;
  ulong uVar4;
  
  if (chunkLength == 0) {
    uVar3 = 0;
    __n = 0;
  }
  else {
    __n = 0;
    do {
      uVar3 = (uint)__n;
      if (data[__n] == '\0') break;
      uVar3 = uVar3 + 1;
      __n = (size_t)uVar3;
    } while (__n < chunkLength);
  }
  if (uVar3 - 0x50 < 0xffffffb1) {
    uVar2 = 0x59;
LAB_0015bcf1:
    key = (char *)0x0;
  }
  else {
    __size = (ulong)(uVar3 + 1);
    key = (char *)malloc(__size);
    uVar2 = 0x53;
    if (key == (char *)0x0) goto LAB_0015bcf1;
    if (uVar3 != 0) {
      memcpy(key,data,__n);
    }
    key[__n] = '\0';
    uVar4 = chunkLength - __size;
    if (chunkLength < __size) {
      uVar4 = 0;
    }
    str = (char *)malloc((ulong)((int)uVar4 + 1));
    if (str != (char *)0x0) {
      uVar4 = uVar4 & 0xffffffff;
      if (uVar4 != 0) {
        memcpy(str,data + __size,uVar4);
      }
      str[uVar4] = '\0';
      size = 0xffffffffffffffff;
      do {
        lVar1 = size + 1;
        size = size + 1;
      } while (str[lVar1] != '\0');
      uVar2 = lodepng_add_text_sized(info,key,str,size);
      goto LAB_0015bcf7;
    }
  }
  str = (char *)0x0;
LAB_0015bcf7:
  free(key);
  free(str);
  return uVar2;
}

Assistant:

static unsigned readChunk_tEXt(LodePNGInfo* info, const unsigned char* data, size_t chunkLength) {
  unsigned error = 0;
  char *key = 0, *str = 0;

  while(!error) /*not really a while loop, only used to break on error*/ {
    unsigned length, string2_begin;

    length = 0;
    while(length < chunkLength && data[length] != 0) ++length;
    /*even though it's not allowed by the standard, no error is thrown if
    there's no null termination char, if the text is empty*/
    if(length < 1 || length > 79) CERROR_BREAK(error, 89); /*keyword too short or long*/

    key = (char*)lodepng_malloc(length + 1);
    if(!key) CERROR_BREAK(error, 83); /*alloc fail*/

    lodepng_memcpy(key, data, length);
    key[length] = 0;

    string2_begin = length + 1; /*skip keyword null terminator*/

    length = (unsigned)(chunkLength < string2_begin ? 0 : chunkLength - string2_begin);
    str = (char*)lodepng_malloc(length + 1);
    if(!str) CERROR_BREAK(error, 83); /*alloc fail*/

    lodepng_memcpy(str, data + string2_begin, length);
    str[length] = 0;

    error = lodepng_add_text(info, key, str);

    break;
  }

  lodepng_free(key);
  lodepng_free(str);

  return error;
}